

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ApplyWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  long in_RSI;
  long in_RDI;
  ImVec2 IVar1;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 local_30 [2];
  ImVec2 local_20;
  ImVec2 local_18;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_20,(float)(int)*(short *)(in_RSI + 4),(float)(int)*(short *)(in_RSI + 6));
  local_18 = ImFloor(in_stack_ffffffffffffffb8);
  *(ImVec2 *)(local_8 + 0x10) = local_18;
  if ((0 < *(short *)(local_10 + 8)) && (0 < *(short *)(local_10 + 10))) {
    ImVec2::ImVec2(local_30,(float)(int)*(short *)(local_10 + 8),
                   (float)(int)*(short *)(local_10 + 10));
    IVar1 = ImFloor(in_stack_ffffffffffffffb8);
    *(ImVec2 *)(local_8 + 0x20) = IVar1;
    *(undefined8 *)(local_8 + 0x18) = *(undefined8 *)(local_8 + 0x20);
  }
  *(byte *)(local_8 + 0x91) = *(byte *)(local_10 + 0xc) & 1;
  return;
}

Assistant:

static void ApplyWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    window->Pos = ImFloor(ImVec2(settings->Pos.x, settings->Pos.y));
    if (settings->Size.x > 0 && settings->Size.y > 0)
        window->Size = window->SizeFull = ImFloor(ImVec2(settings->Size.x, settings->Size.y));
    window->Collapsed = settings->Collapsed;
}